

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O2

void __thiscall
cvm::BasicValue::BasicValue
          (BasicValue *this,BasicType T,
          shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>_> *P)

{
  this->Type = T;
  (this->StrVal)._M_dataplus._M_p = (pointer)&(this->StrVal).field_2;
  (this->StrVal)._M_string_length = 0;
  (this->StrVal).field_2._M_local_buf[0] = '\0';
  std::
  __shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&(this->ArrayPtr).
                  super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
                 ,&P->
                   super___shared_ptr<std::vector<cvm::BasicValue,_std::allocator<cvm::BasicValue>_>,_(__gnu_cxx::_Lock_policy)2>
                );
  return;
}

Assistant:

BasicValue::BasicValue(BasicType T,
                       std::shared_ptr<std::vector<BasicValue>> P)
    : Type(T), ArrayPtr(P) {}